

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

uint32_t calchash(char *str,size_t l)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t h;
  
  uVar3 = l >> 5;
  uVar2 = l & 0xffffffff;
  for (; uVar1 = (uint32_t)uVar2, uVar3 < l; l = l + ~uVar3) {
    uVar2 = (ulong)(uVar1 ^ (uint)(byte)str[l - 1] + (int)(uVar2 >> 2) + uVar1 * 0x20);
  }
  return uVar1;
}

Assistant:

static uint32_t
calchash(const char * str, size_t l) {
	uint32_t h = (uint32_t)l;
	size_t l1;
	size_t step = (l >> 5) + 1;
	for (l1 = l; l1 >= step; l1 -= step) {
		h = h ^ ((h<<5) + (h>>2) + (uint8_t)(str[l1 - 1]));
	}
	return h;
}